

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedString *FS)

{
  Justification JVar1;
  uint NumSpaces;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  int PadAmount;
  size_t Difference;
  FormattedString *FS_local;
  raw_ostream *this_local;
  
  sVar2 = StringRef::size(&FS->Str);
  if ((sVar2 < FS->Width) && (FS->Justify != JustifyNone)) {
    uVar4 = FS->Width;
    sVar2 = StringRef::size(&FS->Str);
    uVar3 = uVar4 - sVar2;
    JVar1 = FS->Justify;
    uVar4 = (uint)uVar3;
    if (JVar1 == JustifyLeft) {
      operator<<(this,FS->Str);
      indent(this,uVar4);
    }
    else if (JVar1 == JustifyRight) {
      indent(this,uVar4);
      operator<<(this,FS->Str);
    }
    else {
      if (JVar1 != JustifyCenter) {
        llvm_unreachable_internal
                  ("Bad Justification",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                   ,0x179);
      }
      NumSpaces = (uint)(uVar3 >> 1);
      indent(this,NumSpaces);
      operator<<(this,FS->Str);
      indent(this,uVar4 - NumSpaces);
    }
  }
  else {
    operator<<(this,FS->Str);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedString &FS) {
  if (FS.Str.size() >= FS.Width || FS.Justify == FormattedString::JustifyNone) {
    this->operator<<(FS.Str);
    return *this;
  }
  const size_t Difference = FS.Width - FS.Str.size();
  switch (FS.Justify) {
  case FormattedString::JustifyLeft:
    this->operator<<(FS.Str);
    this->indent(Difference);
    break;
  case FormattedString::JustifyRight:
    this->indent(Difference);
    this->operator<<(FS.Str);
    break;
  case FormattedString::JustifyCenter: {
    int PadAmount = Difference / 2;
    this->indent(PadAmount);
    this->operator<<(FS.Str);
    this->indent(Difference - PadAmount);
    break;
  }
  default:
    llvm_unreachable("Bad Justification");
  }
  return *this;
}